

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatUtils.h
# Opt level: O3

void xSAT_UtilSort(void **pArray,int nSize,_func_int_void_ptr_void_ptr *CompFnct)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  void *pvVar6;
  xSAT_Clause_t *pC2;
  _func_int_void_ptr_void_ptr *CompFnct_00;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  void **pArray_00;
  xSAT_Clause_t *pC1;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  
  uVar9 = (ulong)(uint)nSize;
  if (0xf < nSize) {
LAB_008f416e:
    pArray_00 = pArray;
    iVar7 = (int)uVar9;
    puVar3 = (uint *)pArray_00[uVar9 >> 1];
    uVar1 = puVar3[1];
    CompFnct_00 = (_func_int_void_ptr_void_ptr *)(long)(int)uVar1;
    lVar11 = -1;
    uVar8 = uVar1;
LAB_008f418a:
    uVar13 = (ulong)(int)lVar11;
    while( true ) {
      lVar11 = ~uVar13 << 3;
      do {
        lVar14 = lVar11;
        uVar10 = uVar13;
        puVar4 = (uint *)pArray_00[uVar10 + 1];
        uVar2 = puVar4[1];
        if ((long)(int)uVar2 < 3) {
          if ((uVar2 == 2) && (1 < (int)uVar8)) goto LAB_008f41fa;
        }
        else if (uVar8 == 2) {
          uVar8 = 2;
          goto LAB_008f41f0;
        }
        uVar15 = *puVar4 >> 4;
        uVar16 = *puVar3 >> 4;
        uVar13 = uVar10 + 1;
        lVar11 = lVar14 + -8;
      } while (uVar15 >= uVar16 && uVar15 != uVar16);
      if ((uVar15 < uVar16) ||
         (uVar8 = uVar1, puVar3[(long)(CompFnct_00 + 2)] <= puVar4[(long)(int)uVar2 + 2])) break;
LAB_008f41f0:
      uVar13 = uVar10 + 1;
    }
LAB_008f41fa:
    uVar9 = (ulong)(int)uVar9;
    lVar11 = uVar10 + 1;
LAB_008f4201:
    do {
      uVar9 = uVar9 - 1;
      puVar5 = (uint *)pArray_00[uVar9];
      if ((int)uVar1 < 3) {
        if ((uVar1 == 2) && (1 < (int)puVar5[1])) goto LAB_008f4247;
      }
      else if (puVar5[1] == 2) goto LAB_008f4201;
      if ((*puVar3 >> 4 <= *puVar5 >> 4) &&
         ((*puVar3 >> 4 < *puVar5 >> 4 ||
          (puVar5[(long)(int)puVar5[1] + 2] <= puVar3[(long)(CompFnct_00 + 2)]))))
      goto LAB_008f4247;
    } while( true );
  }
LAB_008f428b:
  if (1 < nSize) {
    uVar13 = 1;
    uVar9 = 0;
    do {
      uVar12 = uVar9 & 0xffffffff;
      uVar10 = uVar13;
      do {
        puVar3 = (uint *)pArray[uVar10];
        puVar4 = (uint *)pArray[(int)uVar12];
        uVar1 = puVar3[1];
        if ((long)(int)uVar1 < 3) {
          if ((uVar1 != 2) || ((int)puVar4[1] < 2)) goto LAB_008f42d0;
        }
        else {
          if (puVar4[1] != 2) {
LAB_008f42d0:
            if ((*puVar3 >> 4 <= *puVar4 >> 4) &&
               ((*puVar3 >> 4 < *puVar4 >> 4 ||
                (puVar4[(long)(int)puVar4[1] + 2] <= puVar3[(long)(int)uVar1 + 2]))))
            goto LAB_008f42e5;
          }
          uVar12 = uVar10 & 0xffffffff;
        }
LAB_008f42e5:
        uVar10 = uVar10 + 1;
      } while ((uint)nSize != uVar10);
      pvVar6 = pArray[uVar9];
      pArray[uVar9] = pArray[(int)uVar12];
      uVar9 = uVar9 + 1;
      pArray[(int)uVar12] = pvVar6;
      uVar13 = uVar13 + 1;
    } while (uVar9 != nSize - 1);
  }
  return;
LAB_008f4247:
  if ((long)uVar9 <= lVar11) goto LAB_008f425a;
  pArray_00[uVar10 + 1] = puVar5;
  pArray_00[uVar9] = puVar4;
  goto LAB_008f418a;
LAB_008f425a:
  uVar1 = (uint)uVar10;
  xSAT_UtilSort(pArray_00,uVar1 + 1,CompFnct_00);
  uVar8 = ~uVar1 + iVar7;
  uVar9 = (ulong)uVar8;
  pArray = (void **)((long)pArray_00 - lVar14);
  if ((int)uVar8 < 0x10) goto code_r0x008f427c;
  goto LAB_008f416e;
code_r0x008f427c:
  nSize = ~uVar1 + iVar7;
  pArray = (void **)((long)pArray_00 - lVar14);
  goto LAB_008f428b;
}

Assistant:

static void xSAT_UtilSort( void** pArray, int nSize, int(* CompFnct )( const void *, const void *) )
{
    if ( nSize <= 15 )
        xSAT_UtilSelectSort( pArray, nSize, CompFnct );
    else
    {
        void* pPivot = pArray[nSize / 2];
        void* pTmp;
        int i = -1;
        int j = nSize;

        for(;;)
        {
            do i++; while( CompFnct( pArray[i], pPivot ) );
            do j--; while( CompFnct( pPivot, pArray[j] ) );

            if ( i >= j )
                break;

            pTmp = pArray[i];
            pArray[i] = pArray[j];
            pArray[j] = pTmp;
        }

        xSAT_UtilSort( pArray, i, CompFnct );
        xSAT_UtilSort( pArray + i, ( nSize - i ), CompFnct );
    }
}